

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_pyr.h
# Opt level: O3

void vo::ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_>::subsample
               (Image<const_unsigned_short> *img,Image<unsigned_short> *img_sub)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  unsigned_short *puVar12;
  unsigned_short *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  new_allocator<int> local_a1;
  int *local_a0;
  int *local_98;
  unsigned_short *local_90;
  unsigned_short *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  Image<unsigned_short> *local_58;
  long local_50;
  unsigned_short *local_48;
  size_t local_40;
  long local_38;
  
  uVar2 = img_sub->h;
  local_68 = img->w;
  local_98 = __gnu_cxx::new_allocator<int>::allocate(&local_a1,local_68 * uVar2,(void *)0x0);
  lVar1 = uVar2 * 4;
  local_90 = (unsigned_short *)img_sub->h;
  if (0 < (int)local_90) {
    local_40 = img->pitch;
    local_48 = img->ptr;
    uVar14 = (uint)img->h;
    local_80 = img->w;
    local_90 = (unsigned_short *)((ulong)local_90 & 0x7fffffff);
    local_50 = (long)(int)(uVar14 - 1);
    iVar6 = uVar14 - 3;
    iVar17 = 3 - uVar14;
    uVar10 = 2;
    iVar11 = -uVar14;
    local_38 = local_40 * 2;
    uVar19 = 0xffffffff;
    uVar15 = 1;
    uVar9 = 0xfffffffe;
    puVar12 = (unsigned_short *)0x0;
    puVar13 = local_48;
    local_a0 = local_98;
    do {
      local_88 = puVar12;
      uVar14 = uVar14 - 2;
      iVar11 = iVar11 + 2;
      local_70 = (ulong)uVar14;
      lVar18 = (long)iVar17;
      if ((long)iVar17 < (long)iVar6) {
        lVar18 = (long)iVar6;
      }
      lVar7 = (long)iVar11;
      if ((long)iVar11 < (long)(int)uVar14) {
        lVar7 = (long)(int)uVar14;
      }
      local_78 = CONCAT44(local_78._4_4_,uVar19);
      uVar4 = uVar15;
      if ((int)uVar15 < (int)uVar19) {
        uVar4 = uVar19;
      }
      uVar5 = uVar10;
      if ((int)uVar10 < (int)uVar9) {
        uVar5 = uVar9;
      }
      if (0 < (int)local_80) {
        uVar20 = 0;
        piVar8 = local_a0;
        do {
          *piVar8 = (uint)*(ushort *)((long)local_48 + uVar20 * 2 + uVar5 * local_40) +
                    ((uint)puVar13[uVar20] + (uint)puVar13[uVar20] * 2) * 2 +
                    (uint)*(ushort *)((long)local_48 + uVar20 * 2 + (local_50 - lVar18) * local_40)
                    + ((uint)*(ushort *)
                              ((long)local_48 + uVar20 * 2 + (local_50 - lVar7) * local_40) +
                      (uint)*(ushort *)((long)local_48 + uVar20 * 2 + uVar4 * local_40)) * 4;
          uVar20 = uVar20 + 1;
          piVar8 = piVar8 + uVar2;
        } while ((local_80 & 0x7fffffff) != uVar20);
      }
      iVar6 = iVar6 + -2;
      iVar17 = iVar17 + 2;
      puVar13 = puVar13 + local_40;
      uVar19 = uVar19 + 2;
      uVar15 = uVar15 - 2;
      uVar9 = uVar9 + 2;
      uVar10 = uVar10 - 2;
      local_a0 = local_a0 + 1;
      puVar12 = (unsigned_short *)((long)local_88 + 1U);
    } while ((unsigned_short *)((long)local_88 + 1U) != local_90);
  }
  local_a0 = (int *)img_sub->w;
  if (0 < (int)local_a0) {
    iVar6 = (int)local_68;
    iVar17 = iVar6 + -3;
    sVar3 = img_sub->pitch;
    local_88 = img_sub->ptr;
    local_a0 = (int *)((ulong)local_a0 & 0x7fffffff);
    local_80 = (ulong)(iVar6 + -1);
    iVar16 = 3 - iVar6;
    uVar9 = 2;
    iVar11 = -iVar6;
    local_90 = (unsigned_short *)(uVar2 * 8);
    uVar15 = 0xffffffff;
    uVar10 = 1;
    uVar14 = 0xfffffffe;
    piVar8 = local_98;
    uVar20 = 0;
    do {
      local_78 = uVar20;
      iVar6 = iVar6 + -2;
      iVar11 = iVar11 + 2;
      local_70 = CONCAT44(local_70._4_4_,iVar17);
      lVar18 = (long)iVar16;
      if ((long)iVar16 < (long)iVar17) {
        lVar18 = (long)iVar17;
      }
      lVar7 = (long)iVar11;
      if ((long)iVar11 < (long)iVar6) {
        lVar7 = (long)iVar6;
      }
      uVar19 = uVar10;
      if ((int)uVar10 < (int)uVar15) {
        uVar19 = uVar15;
      }
      uVar4 = uVar9;
      if ((int)uVar9 < (int)uVar14) {
        uVar4 = uVar14;
      }
      local_60._0_4_ = (int)uVar2;
      if (0 < (int)local_60) {
        uVar20 = 0;
        puVar12 = local_88;
        do {
          *puVar12 = (unsigned_short)
                     ((uint)(piVar8[uVar20] * 6 +
                             *(int *)((long)local_98 + uVar20 * 4 + (ulong)uVar4 * lVar1) +
                             *(int *)((long)local_98 + uVar20 * 4 + (local_80 - lVar18) * lVar1) +
                             (*(int *)((long)local_98 + uVar20 * 4 + (local_80 - lVar7) * lVar1) +
                             *(int *)((long)local_98 + uVar20 * 4 + (ulong)uVar19 * lVar1)) * 4 +
                            0x80) >> 8);
          uVar20 = uVar20 + 1;
          puVar12 = (unsigned_short *)((long)puVar12 + sVar3);
        } while ((uVar2 & 0x7fffffff) != uVar20);
      }
      iVar17 = iVar17 + -2;
      iVar16 = iVar16 + 2;
      piVar8 = piVar8 + uVar2 * 2;
      uVar15 = uVar15 + 2;
      uVar10 = uVar10 - 2;
      uVar14 = uVar14 + 2;
      uVar9 = uVar9 - 2;
      local_88 = local_88 + 1;
      uVar20 = local_78 + 1;
    } while ((int *)(local_78 + 1) != local_a0);
  }
  if (local_98 != (int *)0x0) {
    local_60 = uVar2;
    local_58 = img_sub;
    operator_delete(local_98,lVar1 * local_68);
  }
  return;
}

Assistant:

static void subsample(const Image<const T>& img, Image<T>& img_sub) {
    static_assert(std::is_same<T, uint16_t>::value ||
                  std::is_same<T, uint8_t>::value);

    constexpr int kernel[5] = {1, 4, 6, 4, 1};

    // accumulator
    ManagedImage<int> tmp(img_sub.h, img.w);

    // Vertical convolution
    {
      for (int r = 0; r < int(img_sub.h); r++) {
        const T* row_m2 = img.RowPtr(std::abs(2 * r - 2));
        const T* row_m1 = img.RowPtr(std::abs(2 * r - 1));
        const T* row = img.RowPtr(2 * r);
        const T* row_p1 = img.RowPtr(border101(2 * r + 1, img.h));
        const T* row_p2 = img.RowPtr(border101(2 * r + 2, img.h));

        for (int c = 0; c < int(img.w); c++) {
          tmp(r, c) = kernel[0] * int(row_m2[c]) + kernel[1] * int(row_m1[c]) +
                      kernel[2] * int(row[c]) + kernel[3] * int(row_p1[c]) +
                      kernel[4] * int(row_p2[c]);
        }
      }
    }

    // Horizontal convolution
    {
      for (int c = 0; c < int(img_sub.w); c++) {
        const int* row_m2 = tmp.RowPtr(std::abs(2 * c - 2));
        const int* row_m1 = tmp.RowPtr(std::abs(2 * c - 1));
        const int* row = tmp.RowPtr(2 * c);
        const int* row_p1 = tmp.RowPtr(border101(2 * c + 1, tmp.h));
        const int* row_p2 = tmp.RowPtr(border101(2 * c + 2, tmp.h));

        for (int r = 0; r < int(tmp.w); r++) {
          int val_int = kernel[0] * row_m2[r] + kernel[1] * row_m1[r] +
                        kernel[2] * row[r] + kernel[3] * row_p1[r] +
                        kernel[4] * row_p2[r];
          T val = ((val_int + (1 << 7)) >> 8);
          img_sub(c, r) = val;
        }
      }
    }
  }